

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

SelectionFlags __thiscall
QAbstractItemViewPrivate::contiguousSelectionCommand
          (QAbstractItemViewPrivate *this,QModelIndex *index,QEvent *event)

{
  Int IVar1;
  Type TVar2;
  QEvent *in_RDX;
  QAbstractItemViewPrivate *in_RDI;
  long in_FS_OFFSET;
  QModelIndex *unaff_retaddr;
  QAbstractItemViewPrivate *in_stack_00000008;
  int Mask;
  SelectionFlags flags;
  QFlagsStorage<QItemSelectionModel::SelectionFlag> in_stack_ffffffffffffffac;
  QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4> local_14;
  QFlagsStorage<QItemSelectionModel::SelectionFlag> local_10;
  QFlagsStorage<QItemSelectionModel::SelectionFlag> local_c;
  QEvent *event_00;
  
  event_00 = *(QEvent **)(in_FS_OFFSET + 0x28);
  local_10.i = 0xaaaaaaaa;
  local_10.i = (Int)extendedSelectionCommand(in_stack_00000008,unaff_retaddr,event_00);
  local_14.super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i =
       (QFlagsStorage<QItemSelectionModel::SelectionFlag>)
       QFlags<QItemSelectionModel::SelectionFlag>::operator&
                 ((QFlags<QItemSelectionModel::SelectionFlag> *)in_RDI,in_stack_ffffffffffffffac.i);
  IVar1 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_14);
  switch(IVar1) {
  case 0:
    if ((in_RDX == (QEvent *)0x0) ||
       ((TVar2 = QEvent::type(in_RDX), TVar2 != MouseButtonPress &&
        (TVar2 = QEvent::type(in_RDX), TVar2 != MouseButtonRelease)))) {
      selectionBehaviorFlags(in_RDI);
      local_c.i = (Int)::operator|(NoUpdate,in_stack_ffffffffffffffac.i);
    }
    else {
      local_c.i = local_10.i;
    }
    break;
  case 1:
  case 3:
  case 0x12:
    local_c.i = local_10.i;
    break;
  default:
    selectionBehaviorFlags(in_RDI);
    local_c.i = (Int)::operator|(NoUpdate,in_stack_ffffffffffffffac.i);
  }
  if (*(QEvent **)(in_FS_OFFSET + 0x28) == event_00) {
    return (QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>)
           (QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>)local_c.i;
  }
  __stack_chk_fail();
}

Assistant:

QItemSelectionModel::SelectionFlags
QAbstractItemViewPrivate::contiguousSelectionCommand(const QModelIndex &index,
                                                     const QEvent *event) const
{
    QItemSelectionModel::SelectionFlags flags = extendedSelectionCommand(index, event);
    const int Mask = QItemSelectionModel::Clear | QItemSelectionModel::Select
                     | QItemSelectionModel::Deselect | QItemSelectionModel::Toggle
                     | QItemSelectionModel::Current;

    switch (flags & Mask) {
    case QItemSelectionModel::Clear:
    case QItemSelectionModel::ClearAndSelect:
    case QItemSelectionModel::SelectCurrent:
        return flags;
    case QItemSelectionModel::NoUpdate:
        if (event &&
            (event->type() == QEvent::MouseButtonPress
             || event->type() == QEvent::MouseButtonRelease))
            return flags;
        return QItemSelectionModel::ClearAndSelect|selectionBehaviorFlags();
    default:
        return QItemSelectionModel::SelectCurrent|selectionBehaviorFlags();
    }
}